

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int ncnn::get_little_cpu_count(void)

{
  int iVar1;
  undefined8 in_RAX;
  CpuSet *unaff_retaddr;
  
  iVar1 = (int)((ulong)in_RAX >> 0x20);
  try_initialize_global_cpu_info();
  get_cpu_thread_affinity_mask(iVar1);
  iVar1 = CpuSet::num_enabled(unaff_retaddr);
  return iVar1;
}

Assistant:

int get_little_cpu_count()
{
    try_initialize_global_cpu_info();
    return get_cpu_thread_affinity_mask(1).num_enabled();
}